

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_rolemaskproxymodel.cpp
# Opt level: O2

void __thiscall tst_RoleMaskProxyModel::testSort(tst_RoleMaskProxyModel *this)

{
  bool bVar1;
  char cVar2;
  int iVar3;
  int iVar4;
  iterator __first;
  iterator __last;
  ModelTest *this_00;
  int iVar5;
  int i;
  Orientation OVar6;
  QModelIndex *local_14d0;
  undefined1 local_14c0 [32];
  RoleMaskProxyModel proxyModel;
  int local_1484;
  Data *local_1480;
  char16_t *local_1478;
  QAbstractItemModel *pQStack_1470;
  anon_union_24_3_e3d07ef4_for_data local_1468;
  QStringList sequence;
  QModelIndex local_1430;
  undefined8 local_1418;
  undefined8 local_1410;
  undefined8 uStack_1408;
  undefined8 local_1400;
  undefined8 local_13f8;
  undefined8 uStack_13f0;
  QArrayDataPointer<char16_t> local_13e8;
  QModelIndex local_13d0;
  QStringListModel baseModel;
  
  sequence.d.d = (Data *)0x0;
  sequence.d.ptr = (QString *)0x0;
  sequence.d.size = 0;
  QList<QString>::reserve(&sequence,100);
  for (iVar5 = 0; iVar5 != 100; iVar5 = iVar5 + 1) {
    local_14c0._0_8_ = (PrivateShared *)0x0;
    local_14c0._8_8_ = L"%1";
    local_14c0._16_8_ = 2;
    local_1468.shared = (PrivateShared *)0x0;
    local_1468._8_8_ = 0;
    local_1468._16_8_ = 0;
    QString::arg((QString *)&baseModel,(QString *)local_14c0,iVar5,3,10,(QChar)0x30);
    QList<QString>::emplaceBack<QString>(&sequence,(QString *)&baseModel);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&baseModel);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_14c0);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_1468);
  }
  __first = QList<QString>::begin(&sequence);
  __last = QList<QString>::end(&sequence);
  std::
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  ::seed((mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          *)&baseModel,0x58);
  std::
  shuffle<QList<QString>::iterator,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
            (__first,__last,
             (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
              *)&baseModel);
  QStringListModel::QStringListModel(&baseModel,(QList *)&sequence,(QObject *)0x0);
  RoleMaskProxyModel::RoleMaskProxyModel(&proxyModel,(QObject *)0x0);
  this_00 = (ModelTest *)operator_new(0x10);
  ModelTest::ModelTest(this_00,(QAbstractItemModel *)&proxyModel,&this->super_QObject);
  RoleMaskProxyModel::setSourceModel((QAbstractItemModel *)&proxyModel);
  RoleMaskProxyModel::addMaskedRole((int)&proxyModel);
  RoleMaskProxyModel::setTransparentIfEmpty(SUB81(&proxyModel,0));
  local_14d0 = (QModelIndex *)0x1;
  RoleMaskProxyModel::setMaskHeaderData(SUB81(&proxyModel,0));
  OVar6 = 0;
  do {
    if (OVar6 == 100) {
      QStringListModel::sort((int)&baseModel,AscendingOrder);
      local_1484 = 99;
      goto LAB_001195f4;
    }
    local_1430.r = -1;
    local_1430.c = -1;
    local_1430.i = 0;
    local_1430.m = (QAbstractItemModel *)0x0;
    iVar4 = (int)(QModelIndex *)&proxyModel;
    QIdentityProxyModel::index((int)(QModelIndex *)&local_1480,iVar4,(QModelIndex *)(ulong)OVar6);
    QModelIndex::data((QVariant *)local_14c0,(QModelIndex *)&local_1480,0);
    QVariant::toString();
    iVar5 = QString::toInt((QString *)&local_1468,(bool *)0x0,10);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_1468);
    QVariant::~QVariant((QVariant *)local_14c0);
    QVariant::QVariant((QVariant *)local_14c0,iVar5);
    iVar3 = (int)(QVariant *)local_14c0;
    bVar1 = (bool)RoleMaskProxyModel::setHeaderData(iVar4,OVar6,(QVariant *)0x2,iVar3);
    cVar2 = QTest::qVerify(bVar1,
                           "proxyModel.setHeaderData(i, Qt::Vertical, currentData, Qt::UserRole)",""
                           ,
                           "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RoleMaskProxyModel/tst_rolemaskproxymodel.cpp"
                           ,0x501);
    QVariant::~QVariant((QVariant *)local_14c0);
    if (cVar2 == '\0') break;
    local_1480 = (Data *)0xffffffffffffffff;
    local_1478 = (char16_t *)0x0;
    pQStack_1470 = (QAbstractItemModel *)0x0;
    QIdentityProxyModel::index((int)&local_1468,iVar4,(QModelIndex *)(ulong)OVar6);
    QVariant::QVariant((QVariant *)local_14c0,iVar5);
    bVar1 = (bool)RoleMaskProxyModel::setData
                            ((QModelIndex *)&proxyModel,(QVariant *)&local_1468,iVar3);
    cVar2 = QTest::qVerify(bVar1,
                           "proxyModel.setData(proxyModel.index(i, 0), currentData, Qt::UserRole)",
                           "",
                           "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RoleMaskProxyModel/tst_rolemaskproxymodel.cpp"
                           ,0x502);
    QVariant::~QVariant((QVariant *)local_14c0);
    OVar6 = OVar6 + Horizontal;
  } while (cVar2 != '\0');
  goto LAB_00119872;
  while( true ) {
    local_1400 = 0xffffffffffffffff;
    local_13f8 = 0;
    uStack_13f0 = 0;
    QIdentityProxyModel::index((int)&local_1430,(int)&proxyModel,local_14d0);
    QModelIndex::data((QVariant *)local_14c0,&local_1430,0);
    QVariant::toString();
    iVar3 = QString::toInt((QString *)&local_1480,(bool *)0x0,10);
    iVar5 = (int)local_14d0;
    local_1418 = 0xffffffffffffffff;
    local_1410 = 0;
    uStack_1408 = 0;
    QIdentityProxyModel::index((int)&local_13d0,(int)&proxyModel,(QModelIndex *)(ulong)(iVar5 - 1U))
    ;
    QModelIndex::data((QVariant *)&local_1468,&local_13d0,0);
    QVariant::toString();
    iVar4 = QString::toInt((QString *)&local_13e8,(bool *)0x0,10);
    cVar2 = QTest::qCompare(iVar3,iVar4 + 1,"proxyModel.index(i, 0).data().toString().toInt()",
                            "proxyModel.index(i - 1, 0).data().toString().toInt() + 1",
                            "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RoleMaskProxyModel/tst_rolemaskproxymodel.cpp"
                            ,0x506);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_13e8);
    QVariant::~QVariant((QVariant *)&local_1468);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_1480);
    QVariant::~QVariant((QVariant *)local_14c0);
    if (cVar2 == '\0') break;
    local_1480 = (Data *)0xffffffffffffffff;
    local_1478 = (char16_t *)0x0;
    pQStack_1470 = (QAbstractItemModel *)0x0;
    QIdentityProxyModel::index((int)&local_1468,(int)&proxyModel,(QModelIndex *)(ulong)(iVar5 - 1U))
    ;
    QModelIndex::data((QVariant *)local_14c0,(QModelIndex *)&local_1468,0x100);
    iVar3 = QVariant::toInt((bool *)local_14c0);
    QVariant::~QVariant((QVariant *)local_14c0);
    local_1480 = (Data *)0xffffffffffffffff;
    local_1478 = (char16_t *)0x0;
    pQStack_1470 = (QAbstractItemModel *)0x0;
    QIdentityProxyModel::index((int)&local_1468,(int)&proxyModel,local_14d0);
    QModelIndex::data((QVariant *)local_14c0,(QModelIndex *)&local_1468,0x100);
    iVar4 = QVariant::toInt((bool *)local_14c0);
    cVar2 = QTest::qCompare(iVar4,iVar3 + 1,"proxyModel.index(i, 0).data(Qt::UserRole).toInt()",
                            "currentData",
                            "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RoleMaskProxyModel/tst_rolemaskproxymodel.cpp"
                            ,0x508);
    QVariant::~QVariant((QVariant *)local_14c0);
    if (cVar2 == '\0') break;
    RoleMaskProxyModel::headerData((int)local_14c0,(Orientation)&proxyModel,iVar5);
    iVar4 = QVariant::toInt((bool *)local_14c0);
    cVar2 = QTest::qCompare(iVar4,iVar3 + 1,
                            "proxyModel.headerData(i, Qt::Vertical, Qt::UserRole).toInt()",
                            "currentData",
                            "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RoleMaskProxyModel/tst_rolemaskproxymodel.cpp"
                            ,0x509);
    QVariant::~QVariant((QVariant *)local_14c0);
    local_14d0 = (QModelIndex *)(ulong)(iVar5 + 1);
    if (cVar2 == '\0') break;
LAB_001195f4:
    bVar1 = local_1484 == 0;
    local_1484 = local_1484 + -1;
    if (bVar1) break;
  }
LAB_00119872:
  RoleMaskProxyModel::~RoleMaskProxyModel(&proxyModel);
  QStringListModel::~QStringListModel(&baseModel);
  QArrayDataPointer<QString>::~QArrayDataPointer(&sequence.d);
  return;
}

Assistant:

void tst_RoleMaskProxyModel::testSort()
{
    QStringList sequence;
    sequence.reserve(100);
    for (int i = 0; i < 100; ++i)
        sequence.append(QStringLiteral("%1").arg(i, 3, 10, QLatin1Char('0')));
    std::shuffle(sequence.begin(), sequence.end(), std::mt19937(88));
    QStringListModel baseModel(sequence);
    RoleMaskProxyModel proxyModel;
    new ModelTest(&proxyModel, this);
    proxyModel.setSourceModel(&baseModel);
    proxyModel.addMaskedRole(Qt::UserRole);
    proxyModel.setTransparentIfEmpty(true);
    proxyModel.setMaskHeaderData(true);
    for (int i = 0; i < 100; ++i) {
        const int currentData = proxyModel.index(i, 0).data().toString().toInt();
        QVERIFY(proxyModel.setHeaderData(i, Qt::Vertical, currentData, Qt::UserRole));
        QVERIFY(proxyModel.setData(proxyModel.index(i, 0), currentData, Qt::UserRole));
    }
    baseModel.sort(0, Qt::AscendingOrder);
    for (int i = 1; i < 100; ++i) {
        QCOMPARE(proxyModel.index(i, 0).data().toString().toInt(), proxyModel.index(i - 1, 0).data().toString().toInt() + 1);
        const int currentData = proxyModel.index(i - 1, 0).data(Qt::UserRole).toInt() + 1;
        QCOMPARE(proxyModel.index(i, 0).data(Qt::UserRole).toInt(), currentData);
        QCOMPARE(proxyModel.headerData(i, Qt::Vertical, Qt::UserRole).toInt(), currentData);
    }
}